

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleDefaultDecayTimeDirective(Preprocessor *this,Token directive)

{
  bool bVar1;
  DefaultDecayTimeDirectiveSyntax *syntax;
  Token *in_RDI;
  Token TVar2;
  DefaultDecayTimeDirectiveSyntax *result;
  Token time;
  undefined6 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3e;
  Preprocessor *in_stack_ffffffffffffff40;
  Token in_stack_ffffffffffffff48;
  Token *args_1;
  Token in_stack_ffffffffffffff58;
  TokenKind TStack_62;
  Preprocessor *local_60;
  TokenKind local_58;
  undefined8 in_stack_ffffffffffffffb8;
  Preprocessor *in_stack_ffffffffffffffc0;
  Trivia local_10;
  
  TStack_62 = (TokenKind)((ulong)in_stack_ffffffffffffffb8 >> 0x30);
  checkOutsideDesignElement(in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  Token::Token(in_RDI);
  TVar2 = peek((Preprocessor *)CONCAT26(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38));
  args_1 = (Token *)in_stack_ffffffffffffff48.info;
  local_58 = TVar2.kind;
  if (local_58 == Identifier) {
    peek((Preprocessor *)CONCAT26(2,in_stack_ffffffffffffff38));
    Token::valueText((Token *)in_stack_ffffffffffffff40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
               (char *)CONCAT26(local_58,in_stack_ffffffffffffff38));
    args_1 = (Token *)in_stack_ffffffffffffff48.info;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)
                            in_stack_ffffffffffffff58,
                            (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                            in_stack_ffffffffffffff48);
    local_60 = in_stack_ffffffffffffffc0;
    if (bVar1) {
      in_stack_ffffffffffffff58 = consume(in_stack_ffffffffffffff40);
      TStack_62 = in_stack_ffffffffffffff58.rawLen._2_2_;
      local_60 = (Preprocessor *)in_stack_ffffffffffffff58.info;
    }
  }
  else if ((local_58 == IntegerLiteral) ||
          (local_60 = in_stack_ffffffffffffffc0, local_58 == RealLiteral)) {
    TVar2 = consume(in_stack_ffffffffffffff40);
    TStack_62 = TVar2.rawLen._2_2_;
    local_60 = (Preprocessor *)TVar2.info;
  }
  bVar1 = Token::operator_cast_to_bool((Token *)0x36c135);
  if (!bVar1) {
    TVar2 = expect(local_60,TStack_62);
    args_1 = (Token *)TVar2.info;
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::DefaultDecayTimeDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     ((BumpAllocator *)in_stack_ffffffffffffff58.info,
                      in_stack_ffffffffffffff58._0_8_,args_1);
  Trivia::Trivia(&local_10,Directive,(SyntaxNode *)syntax);
  return local_10;
}

Assistant:

Trivia Preprocessor::handleDefaultDecayTimeDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token time;
    switch (peek().kind) {
        case TokenKind::IntegerLiteral:
        case TokenKind::RealLiteral:
            time = consume();
            break;
        case TokenKind::Identifier:
            if (peek().valueText() == "infinite")
                time = consume();
            break;
        default:
            break;
    }

    if (!time)
        time = expect(TokenKind::IntegerLiteral);

    auto result = alloc.emplace<DefaultDecayTimeDirectiveSyntax>(directive, time);
    return Trivia(TriviaKind::Directive, result);
}